

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_flattened_io_block
          (CompilerGLSL *this,SPIRVariable *var,char *qual)

{
  ID *__k;
  unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
  *this_00;
  char *pcVar1;
  size_t sVar2;
  TypedID<(diligent_spirv_cross::Types)1> *pTVar3;
  Bitset *pBVar4;
  SPIRType *type;
  ulong uVar5;
  mapped_type *pmVar6;
  SPIRType *pSVar7;
  mapped_type *pmVar8;
  CompilerError *this_01;
  long lVar9;
  long lVar10;
  SmallVector<unsigned_int,_8UL> member_indices;
  string basename;
  Bitset old_flags;
  uint32_t local_cc;
  SmallVector<unsigned_int,_8UL> local_c8;
  string local_90;
  uint64_t local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  type = Variant::get<diligent_spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                    ptr + *(uint *)&(var->super_IVariant).field_0xc);
  if ((type->array).super_VectorView<unsigned_int>.buffer_size == 0) {
    uVar5 = (ulong)(type->type_alias).id;
    if (uVar5 != 0) {
      type = Variant::get<diligent_spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.
                        super_VectorView<diligent_spirv_cross::Variant>.ptr + uVar5);
    }
    this_00 = &(this->super_Compiler).ir.meta;
    __k = &(type->super_IVariant).self;
    pmVar6 = ::std::__detail::
             _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    local_70 = (pmVar6->decoration).decoration_flags.lower;
    local_c8.super_VectorView<unsigned_int>.ptr = (uint *)&local_68;
    local_68._M_buckets = (__buckets_ptr)0x0;
    local_68._M_bucket_count = (pmVar6->decoration).decoration_flags.higher._M_h._M_bucket_count;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = (pmVar6->decoration).decoration_flags.higher._M_h._M_element_count;
    pBVar4 = &(pmVar6->decoration).decoration_flags;
    local_68._M_rehash_policy._M_max_load_factor =
         (pBVar4->higher)._M_h._M_rehash_policy._M_max_load_factor;
    local_68._M_rehash_policy._4_4_ =
         *(undefined4 *)&(pBVar4->higher)._M_h._M_rehash_policy.field_0x4;
    local_68._M_rehash_policy._M_next_resize =
         (pmVar6->decoration).decoration_flags.higher._M_h._M_rehash_policy._M_next_resize;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_c8.super_VectorView<unsigned_int>.ptr,
               &(pmVar6->decoration).decoration_flags.higher._M_h,
               (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> *)
               &local_c8);
    pmVar6 = ::std::__detail::
             _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    pBVar4 = &(pmVar6->decoration).decoration_flags;
    *(byte *)&pBVar4->lower = (byte)pBVar4->lower | 4;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(type->member_name_cache)._M_h);
    local_c8.super_VectorView<unsigned_int>.ptr = (uint *)&local_c8.stack_storage;
    local_c8.super_VectorView<unsigned_int>.buffer_size = 0;
    local_c8.buffer_capacity = 8;
    SmallVector<unsigned_int,_8UL>::reserve(&local_c8,1);
    pcVar1 = (char *)local_c8.super_VectorView<unsigned_int>.ptr +
             local_c8.super_VectorView<unsigned_int>.buffer_size * 4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    local_c8.super_VectorView<unsigned_int>.buffer_size =
         local_c8.super_VectorView<unsigned_int>.buffer_size + 1;
    (*(this->super_Compiler)._vptr_Compiler[6])
              (&local_90,this,(ulong)(var->super_IVariant).self.id,1);
    sVar2 = (type->member_types).
            super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
            buffer_size;
    if (sVar2 != 0) {
      pTVar3 = (type->member_types).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr;
      lVar10 = sVar2 << 2;
      lVar9 = 0;
      do {
        add_member_name(this,type,(uint32_t)lVar9);
        pSVar7 = Variant::get<diligent_spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.
                            super_VectorView<diligent_spirv_cross::Variant>.ptr + pTVar3[lVar9].id);
        *(uint32_t *)
         ((char *)local_c8.super_VectorView<unsigned_int>.ptr +
         local_c8.super_VectorView<unsigned_int>.buffer_size * 4 + -4) = (uint32_t)lVar9;
        if (pSVar7->basetype == Struct) {
          emit_flattened_io_block_struct(this,&local_90,type,qual,&local_c8);
        }
        else {
          emit_flattened_io_block_member(this,&local_90,type,qual,&local_c8);
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + -4;
      } while (lVar10 != 0);
    }
    pmVar6 = ::std::__detail::
             _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,__k);
    (pmVar6->decoration).decoration_flags.lower = local_70;
    if ((Bitset *)&local_70 != &(pmVar6->decoration).decoration_flags) {
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&(pmVar6->decoration).decoration_flags.higher,&local_68);
    }
    local_cc = (var->super_IVariant).self.id;
    pmVar8 = ::std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->flattened_structs,&local_cc);
    *pmVar8 = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_c8.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_c8.super_VectorView<unsigned_int>.ptr !=
        &local_c8.stack_storage) {
      free(local_c8.super_VectorView<unsigned_int>.ptr);
    }
    ::std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
    return;
  }
  this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (this_01,"Array of varying structs cannot be flattened to legacy-compatible varyings.");
  __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerGLSL::emit_flattened_io_block(const SPIRVariable &var, const char *qual)
{
	auto &var_type = get<SPIRType>(var.basetype);
	if (!var_type.array.empty())
		SPIRV_CROSS_THROW("Array of varying structs cannot be flattened to legacy-compatible varyings.");

	// Emit flattened types based on the type alias. Normally, we are never supposed to emit
	// struct declarations for aliased types.
	auto &type = var_type.type_alias ? get<SPIRType>(var_type.type_alias) : var_type;

	auto old_flags = ir.meta[type.self].decoration.decoration_flags;
	// Emit the members as if they are part of a block to get all qualifiers.
	ir.meta[type.self].decoration.decoration_flags.set(DecorationBlock);

	type.member_name_cache.clear();

	SmallVector<uint32_t> member_indices;
	member_indices.push_back(0);
	auto basename = to_name(var.self);

	uint32_t i = 0;
	for (auto &member : type.member_types)
	{
		add_member_name(type, i);
		auto &membertype = get<SPIRType>(member);

		member_indices.back() = i;
		if (membertype.basetype == SPIRType::Struct)
			emit_flattened_io_block_struct(basename, type, qual, member_indices);
		else
			emit_flattened_io_block_member(basename, type, qual, member_indices);
		i++;
	}

	ir.meta[type.self].decoration.decoration_flags = old_flags;

	// Treat this variable as fully flattened from now on.
	flattened_structs[var.self] = true;
}